

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O1

Constraint *
slang::ast::DisableSoftConstraint::fromSyntax(DisableConstraintSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  bool bVar1;
  int iVar2;
  RandMode RVar3;
  undefined4 extraout_var;
  DisableSoftConstraint *pDVar4;
  InvalidConstraint *pIVar5;
  pair<const_slang::ast::Symbol_*,_slang::SourceRange> *args_00;
  pair<const_slang::ast::Symbol_*,_slang::SourceRange> local_48;
  Constraint *local_30;
  Expression *args;
  
  args_00 = &local_48;
  this = ((context->scope).ptr)->compilation;
  iVar2 = Expression::bind((int)(syntax->name).ptr,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  pDVar4 = BumpAllocator::emplace<slang::ast::DisableSoftConstraint,slang::ast::Expression_const&>
                     (&this->super_BumpAllocator,args);
  bVar1 = Expression::bad(args);
  if (!bVar1) {
    getConstraintPrimary(&local_48,args);
    if ((local_48.first != (Symbol *)0x0) &&
       (RVar3 = ASTContext::getRandMode(context,local_48.first), RVar3 == Rand)) {
      return &pDVar4->super_Constraint;
    }
    ASTContext::addDiag(context,(DiagCode)0x20008,local_48.second);
    args_00 = (pair<const_slang::ast::Symbol_*,_slang::SourceRange> *)&local_30;
  }
  *(DisableSoftConstraint **)args_00 = pDVar4;
  pIVar5 = BumpAllocator::emplace<slang::ast::InvalidConstraint,slang::ast::Constraint_const*&>
                     (&this->super_BumpAllocator,(Constraint **)args_00);
  return &pIVar5->super_Constraint;
}

Assistant:

Constraint& DisableSoftConstraint::fromSyntax(const DisableConstraintSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = Expression::bind(*syntax.name, context);
    auto result = comp.emplace<DisableSoftConstraint>(expr);
    if (expr.bad())
        return badConstraint(comp, result);

    auto [sym, sourceRange] = getConstraintPrimary(expr);
    if (!sym || context.getRandMode(*sym) != RandMode::Rand) {
        context.addDiag(diag::BadDisableSoft, sourceRange);
        return badConstraint(comp, result);
    }

    return *result;
}